

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Tools.h
# Opt level: O0

pair<std::basic_string_view<char,_std::char_traits<char>_>,_unsigned_long> *
snip_between(pair<std::basic_string_view<char,_std::char_traits<char>_>,_unsigned_long>
             *__return_storage_ptr__,string_view source,string *from,string *to,size_t start)

{
  size_type sVar1;
  size_type sVar2;
  size_type sVar3;
  long lVar4;
  long lVar5;
  basic_string_view<char,_std::char_traits<char>_> __str;
  int local_74;
  basic_string_view<char,_std::char_traits<char>_> local_70;
  basic_string_view<char,_std::char_traits<char>_> local_60;
  size_type local_50;
  size_t end;
  char *local_40;
  size_type local_38;
  size_t begin;
  size_t start_local;
  string *to_local;
  string *from_local;
  string_view source_local;
  
  source_local._M_len = (size_t)source._M_str;
  from_local = (string *)source._M_len;
  begin = start;
  start_local = (size_t)to;
  to_local = from;
  __str = (basic_string_view<char,_std::char_traits<char>_>)
          std::__cxx11::string::operator_cast_to_basic_string_view((string *)from);
  local_40 = __str._M_str;
  end = __str._M_len;
  local_38 = std::basic_string_view<char,_std::char_traits<char>_>::find
                       ((basic_string_view<char,_std::char_traits<char>_> *)&from_local,__str,begin)
  ;
  if (local_38 != 0xffffffffffffffff) {
    local_60 = (basic_string_view<char,_std::char_traits<char>_>)
               std::__cxx11::string::operator_cast_to_basic_string_view((string *)start_local);
    sVar2 = local_38;
    lVar4 = std::__cxx11::string::length();
    local_50 = std::basic_string_view<char,_std::char_traits<char>_>::find
                         ((basic_string_view<char,_std::char_traits<char>_> *)&from_local,local_60,
                          sVar2 + lVar4);
    sVar2 = local_38;
    if (local_50 != 0xffffffffffffffff) {
      lVar4 = std::__cxx11::string::length();
      sVar3 = local_38;
      sVar1 = local_50;
      lVar5 = std::__cxx11::string::length();
      local_70 = std::basic_string_view<char,_std::char_traits<char>_>::substr
                           ((basic_string_view<char,_std::char_traits<char>_> *)&from_local,
                            sVar2 + lVar4,sVar1 - (sVar3 + lVar5));
      std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_unsigned_long>::
      pair<std::basic_string_view<char,_std::char_traits<char>_>,_true>
                (__return_storage_ptr__,&local_70,&local_50);
      return __return_storage_ptr__;
    }
    local_50 = 0xffffffffffffffff;
  }
  local_74 = 0;
  std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_unsigned_long>::
  pair<const_char_(&)[1],_int,_true>(__return_storage_ptr__,(char (*) [1])0x305f8b,&local_74);
  return __return_storage_ptr__;
}

Assistant:

inline std::pair<std::string_view, size_t> snip_between(std::string_view source, const std::string& from, const std::string& to, size_t start = 0) {
    const size_t begin = source.find(from, start);
    if (begin != std::string::npos) {
        const size_t end = source.find(to, begin + from.length());
        if (end != std::string::npos) {
            return { source.substr(begin + from.length(), end - (begin + from.length())), end };
        }
    }

    return { "", 0 };
}